

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_BigPositional_Test::~TApp_BigPositional_Test(TApp_BigPositional_Test *this)

{
  TApp_BigPositional_Test *this_local;
  
  ~TApp_BigPositional_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, BigPositional) {
    std::vector<std::string> vec;
    app.add_option("pos", vec);

    args = {"one"};

    run();
    EXPECT_EQ(args, vec);

    app.reset();

    args = {"one", "two"};
    run();

    EXPECT_EQ(args, vec);
}